

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_AddPeginTxIn_Test::TestBody
          (ConfidentialTransactionContext_AddPeginTxIn_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertionResult gtest_ar;
  ByteData txout_proof;
  ByteData tx_byte;
  Script claim_script;
  BlockHash mainchain_hash;
  ConfidentialAssetId asset;
  Amount pegin_amount;
  OutPoint outpoint;
  Address addr;
  ElementsConfidentialAddress ct_addr;
  ConfidentialTransactionContext txc;
  undefined8 in_stack_fffffffffffff868;
  ConfidentialTransactionContext *in_stack_fffffffffffff870;
  ElementsConfidentialAddress *this_00;
  AssertHelper local_708;
  Message local_700;
  string local_6f8;
  internal local_6d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff930;
  undefined6 in_stack_fffffffffffff941;
  undefined1 in_stack_fffffffffffff947;
  ConfidentialAssetId *in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff951;
  undefined7 in_stack_fffffffffffff961;
  allocator local_681;
  string local_680;
  ConfidentialAssetId local_660;
  int64_t local_638;
  undefined1 local_630;
  Amount local_628;
  Script *in_stack_fffffffffffff9e8;
  BlockHash *in_stack_fffffffffffff9f0;
  ConfidentialAssetId *in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  undefined8 in_stack_fffffffffffffa08;
  ConfidentialTransactionContext *in_stack_fffffffffffffa10;
  ByteData *in_stack_fffffffffffffa20;
  ByteData *in_stack_fffffffffffffa28;
  string local_5d0;
  ByteData local_5b0;
  allocator local_591;
  string local_590;
  Script local_570;
  allocator local_531;
  string local_530;
  BlockHash local_510;
  allocator local_4e9;
  string local_4e8;
  ConfidentialAssetId local_4c8;
  Amount local_4a0;
  allocator local_489;
  string local_488;
  Txid local_468;
  OutPoint local_448;
  Address local_420;
  allocator local_291;
  string local_290;
  ElementsConfidentialAddress local_270;
  ConfidentialTransaction local_c0 [3];
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (in_stack_fffffffffffff870,(uint32_t)((ulong)in_stack_fffffffffffff868 >> 0x20),
             (uint32_t)in_stack_fffffffffffff868);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_290,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3",
             &local_291);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_270,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress(&local_420,&local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_488,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_489);
  cfd::core::Txid::Txid(&local_468,&local_488);
  cfd::core::OutPoint::OutPoint(&local_448,&local_468,2);
  cfd::core::Txid::~Txid((Txid *)0x2229c1);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  cfd::core::Amount::Amount(&local_4a0,0xbefe33cc397c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4e8,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_4e9);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_4c8,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_530,"06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f"
             ,&local_531);
  cfd::core::BlockHash::BlockHash(&local_510,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_590,"0014e8d28b573816ddfcf98578d7b28543e273f5a72a",&local_591);
  cfd::core::Script::Script(&local_570,&local_590);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,
             "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"
             ,(allocator *)&stack0xfffffffffffffa2f);
  cfd::core::ByteData::ByteData(&local_5b0,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffa2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffff9f0,
             "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"
             ,(allocator *)&stack0xfffffffffffff9ef);
  cfd::core::ByteData::ByteData
            ((ByteData *)&stack0xfffffffffffffa10,(string *)&stack0xfffffffffffff9f0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff9f0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff9ef);
  this_00 = (ElementsConfidentialAddress *)&stack0xfffffffffffffa10;
  cfd::ConfidentialTransactionContext::AddPeginTxIn
            (in_stack_fffffffffffffa10,(OutPoint *)in_stack_fffffffffffffa08,
             (Amount *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0
             ,in_stack_fffffffffffff9e8,in_stack_fffffffffffffa20,in_stack_fffffffffffffa28);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(100000);
  local_638 = AVar3.amount_;
  local_630 = AVar3.ignore_check_;
  local_628.amount_ = local_638;
  local_628.ignore_check_ = (bool)local_630;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_680,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_681);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_660,&local_680);
  cfd::core::ConfidentialTransaction::AddTxOutFee(local_c0,&local_628,&local_660);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x222cd6);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  AVar3 = cfd::core::operator-(&local_4a0,200000);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)
             CONCAT71(in_stack_fffffffffffff961,AVar3.ignore_check_),
             (ElementsConfidentialAddress *)AVar3.amount_,
             (Amount *)CONCAT71(in_stack_fffffffffffff951,in_stack_fffffffffffff950),
             in_stack_fffffffffffff948,(bool)in_stack_fffffffffffff947);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(200000);
  cfd::ConfidentialTransactionContext::UpdateFeeAmount
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_fffffffffffff947,
                      CONCAT61(in_stack_fffffffffffff941,AVar3.ignore_check_)),
             (Amount *)AVar3.amount_,(ConfidentialAssetId *)in_stack_fffffffffffff930.ptr_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_6f8,&local_c0[0].super_AbstractTransaction);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            (local_6d8,"txc.GetHex().c_str()",
             "\"020000000101a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000030d4000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33c92c3c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac0000000000000006087c39cc33febe00002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a200f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206160014e8d28b573816ddfcf98578d7b28543e273f5a72ae002000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d10000009703000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d9010500000000\""
             ,pcVar2,
             "020000000101a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000030d4000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33c92c3c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac0000000000000006087c39cc33febe00002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a200f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206160014e8d28b573816ddfcf98578d7b28543e273f5a72ae002000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d10000009703000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d9010500000000"
            );
  std::__cxx11::string::~string((string *)&local_6f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x223188);
    testing::internal::AssertHelper::AssertHelper
              (&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x206,pcVar2);
    testing::internal::AssertHelper::operator=(&local_708,&local_700);
    testing::internal::AssertHelper::~AssertHelper(&local_708);
    testing::Message::~Message((Message *)0x2231e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x22323d);
  cfd::core::ByteData::~ByteData((ByteData *)0x22324a);
  cfd::core::ByteData::~ByteData((ByteData *)0x223257);
  cfd::core::Script::~Script((Script *)this_00);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x223271);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x22327e);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x22328b);
  cfd::core::Address::~Address(&this_00->unblinded_address_);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_00);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_00);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddPeginTxIn)
{
  ConfidentialTransactionContext txc(2, 0);
  ElementsConfidentialAddress ct_addr("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
  Address addr = ct_addr.GetUnblindedAddress();
  OutPoint outpoint = OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 2);
  Amount pegin_amount(int64_t{209998999992700});
  ConfidentialAssetId asset("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  BlockHash mainchain_hash("06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f");
  Script claim_script("0014e8d28b573816ddfcf98578d7b28543e273f5a72a");
  ByteData tx_byte("02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000");
  ByteData txout_proof("03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105");
  txc.AddPeginTxIn(outpoint, pegin_amount, asset, mainchain_hash, claim_script, tx_byte, txout_proof);
  txc.AddTxOutFee(
      Amount::CreateBySatoshiAmount(100000),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  txc.AddTxOut(
      ct_addr,
      pegin_amount - 200000,
      asset);
  txc.UpdateFeeAmount(Amount::CreateBySatoshiAmount(200000), asset);

  EXPECT_STREQ(txc.GetHex().c_str(), "020000000101a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000030d4000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33c92c3c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac0000000000000006087c39cc33febe00002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a200f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206160014e8d28b573816ddfcf98578d7b28543e273f5a72ae002000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d10000009703000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d9010500000000");
}